

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O3

void TestFastDtoaGayShortest(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  PrecomputedShortest *pPVar5;
  char *pcVar6;
  uint uVar7;
  undefined8 uVar8;
  long lVar9;
  Vector<const_double_conversion::PrecomputedShortest> VVar10;
  Vector<char> buffer;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff38;
  int local_bc;
  uint local_a8;
  int local_a4;
  PrecomputedShortest *local_a0;
  char local_98 [104];
  
  VVar10 = double_conversion::PrecomputedShortestRepresentations();
  pPVar5 = VVar10.start_;
  uVar7 = VVar10.length_;
  if (0 < (int)uVar7) {
    lVar9 = 0;
    local_bc = 0;
    bVar3 = false;
    local_a0 = pPVar5;
    do {
      pcVar6 = *(char **)((long)&pPVar5->representation + lVar9);
      uVar1 = *(uint *)((long)&pPVar5->decimal_point + lVar9);
      buffer._8_8_ = &local_a4;
      buffer.start_ = (char *)0x64;
      bVar2 = double_conversion::FastDtoa
                        ((double_conversion *)0x0,*(double *)((long)&pPVar5->v + lVar9),
                         FAST_DTOA_SHORTEST,(int)local_98,buffer,(int *)&local_a8,
                         in_stack_ffffffffffffff38);
      if (0x11 < local_a4) {
        pcVar6 = "kFastDtoaMaximalLength >= length";
        uVar8 = 0x13f;
        goto LAB_008644d0;
      }
      if (bVar2) {
        bVar2 = local_a4 == 0x11;
        if (uVar1 != local_a8) {
          printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
                 ,0x143,"current_test.decimal_point","point",(ulong)uVar1,
                 CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),local_a8));
LAB_0086450a:
          abort();
        }
        if (pcVar6 == (char *)0x0) goto LAB_0086450a;
        iVar4 = strcmp(pcVar6,local_98);
        if (iVar4 != 0) {
          printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
                 ,0x144,"current_test.representation","buffer.start()",pcVar6,local_98);
          abort();
        }
        bVar3 = (bool)(bVar3 | bVar2);
        local_bc = local_bc + 1;
        pPVar5 = local_a0;
      }
      lVar9 = lVar9 + 0x18;
    } while ((ulong)uVar7 * 0x18 != lVar9);
    if (0.99 < (double)local_bc / (double)(int)uVar7) {
      if (bVar3) {
        return;
      }
      pcVar6 = "needed_max_length";
      uVar8 = 0x147;
      goto LAB_008644d0;
    }
  }
  pcVar6 = "succeeded*1.0/total > 0.99";
  uVar8 = 0x146;
LAB_008644d0:
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
         ,uVar8,pcVar6);
  abort();
}

Assistant:

TEST(FastDtoaGayShortest) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool status;
  int length;
  int point;
  int succeeded = 0;
  int total = 0;
  bool needed_max_length = false;

  Vector<const PrecomputedShortest> precomputed =
      PrecomputedShortestRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedShortest current_test = precomputed[i];
    total++;
    double v = current_test.v;
    status = FastDtoa(v, FAST_DTOA_SHORTEST, 0, buffer, &length, &point);
    CHECK(kFastDtoaMaximalLength >= length);
    if (!status) continue;
    if (length == kFastDtoaMaximalLength) needed_max_length = true;
    succeeded++;
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
  CHECK(succeeded*1.0/total > 0.99);
  CHECK(needed_max_length);
}